

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

void __thiscall
dlib::
add_layer<dlib::con_<1024L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<256L,_3L,_3L,_1,_1,_1,_1>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<256L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>
::update_parameters<dlib::sgd>
          (add_layer<dlib::con_<1024L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<256L,_3L,_3L,_1,_1,_1,_1>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<256L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>
           *this,sstack<dlib::sgd> solvers,double learning_rate)

{
  sstack<dlib::sgd> solvers_00;
  size_t sVar1;
  ostream *poVar2;
  ostream *poVar3;
  string *a;
  sgd *in_RSI;
  con_<1024L,_1L,_1L,_1,_1,_0,_0> *in_RDI;
  add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<256L,_3L,_3L,_1,_1,_1,_1>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<256L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>,_void>,_void>,_void>,_void>,_void>,_void>
  *in_XMM0_Qa;
  double dVar4;
  tensor *step;
  ostringstream dlib_o_out;
  tensor *in_stack_fffffffffffffd98;
  tensor *in_stack_fffffffffffffda0;
  con_<1024L,_1L,_1L,_1,_1,_0,_0> *in_stack_fffffffffffffdb0;
  tensor *in_stack_fffffffffffffdb8;
  error_type t;
  con_<1024L,_1L,_1L,_1,_1,_0,_0> *in_stack_fffffffffffffdc0;
  undefined8 in_stack_fffffffffffffdc8;
  float learning_rate_00;
  sgd *in_stack_fffffffffffffdd0;
  ostringstream local_198 [328];
  sstack<dlib::sgd> *in_stack_ffffffffffffffb0;
  size_t in_stack_ffffffffffffffb8;
  sstack<dlib::sgd> *in_stack_ffffffffffffffc0;
  double in_stack_ffffffffffffffd8;
  con_<1024L,_1L,_1L,_1,_1,_0,_0> *pcVar5;
  
  learning_rate_00 = (float)((ulong)in_stack_fffffffffffffdc8 >> 0x20);
  pcVar5 = in_RDI;
  sVar1 = sstack<dlib::sgd>::size((sstack<dlib::sgd> *)&stack0xfffffffffffffff0);
  if (6 < sVar1) {
    sVar1 = tensor::size((tensor *)&in_RDI[1].conv.impl.last_padding_x);
    if (sVar1 != 0) {
      dVar4 = get_learning_rate_multiplier<dlib::con_<1024l,1l,1l,1,1,0,0>>
                        (in_stack_fffffffffffffdb0);
      if ((dVar4 != 0.0) || (NAN(dVar4))) {
        sstack<dlib::sgd>::top(in_stack_ffffffffffffffb0);
        sgd::operator()(in_stack_fffffffffffffdd0,learning_rate_00,in_stack_fffffffffffffdc0,
                        in_stack_fffffffffffffdb8);
        con_<1024L,_1L,_1L,_1,_1,_0,_0>::get_layer_params(in_RDI);
        con_<1024L,_1L,_1L,_1,_1,_0,_0>::get_layer_params(in_RDI);
        tt::add(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,(tensor *)0x219345);
      }
    }
    std::
    unique_ptr<dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<256L,_3L,_3L,_1,_1,_1,_1>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<256L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_std::default_delete<dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<256L,_3L,_3L,_1,_1,_1,_1>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<256L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>,_void>,_void>,_void>,_void>,_void>,_void>_>_>
    ::operator->((unique_ptr<dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<256L,_3L,_3L,_1,_1,_1,_1>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<256L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_std::default_delete<dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<256L,_3L,_3L,_1,_1,_1,_1>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<256L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>,_void>,_void>,_void>,_void>,_void>,_void>_>_>
                  *)0x219356);
    sstack<dlib::sgd>::pop(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    solvers_00.mysize = (size_t)in_RSI;
    solvers_00.data = (sgd *)pcVar5;
    add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<256L,_3L,_3L,_1,_1,_1,_1>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<256L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>,_void>,_void>,_void>,_void>,_void>,_void>
    ::update_parameters<dlib::sgd>(in_XMM0_Qa,solvers_00,in_stack_ffffffffffffffd8);
    return;
  }
  dlib_assert_breakpoint();
  std::__cxx11::ostringstream::ostringstream(local_198);
  poVar2 = std::operator<<((ostream *)local_198,"\n\nError detected at line ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x3ed);
  std::operator<<(poVar2,".\n");
  poVar2 = std::operator<<((ostream *)local_198,"Error detected in file ");
  poVar2 = std::operator<<(poVar2,
                           "/workspace/llm4binary/github/license_c_cmakelists/arrufat[P]dlib-pytorch-benchmark/external/dlib/dlib/../dlib/dnn/core.h"
                          );
  std::operator<<(poVar2,".\n");
  poVar2 = std::operator<<((ostream *)local_198,"Error detected in function ");
  poVar2 = std::operator<<(poVar2,
                           "void dlib::add_layer<dlib::con_<1024, 1, 1, 1, 1>, dlib::add_layer<dlib::relu_, dlib::add_layer<dlib::bn_<dlib::CONV_MODE>, dlib::add_layer<dlib::con_<256, 3, 3, 1, 1>, dlib::add_layer<dlib::relu_, dlib::add_layer<dlib::bn_<dlib::CONV_MODE>, dlib::add_layer<dlib::con_<256, 1, 1, 1, 1>, dlib::add_tag_layer<1, dlib::impl::repeat_input_layer>>>>>>>>::update_parameters(sstack<solver_type>, double) [LAYER_DETAILS = dlib::con_<1024, 1, 1, 1, 1>, SUBNET = dlib::add_layer<dlib::relu_, dlib::add_layer<dlib::bn_<dlib::CONV_MODE>, dlib::add_layer<dlib::con_<256, 3, 3, 1, 1>, dlib::add_layer<dlib::relu_, dlib::add_layer<dlib::bn_<dlib::CONV_MODE>, dlib::add_layer<dlib::con_<256, 1, 1, 1, 1>, dlib::add_tag_layer<1, dlib::impl::repeat_input_layer>>>>>>>, enabled = void, solver_type = dlib::sgd]"
                          );
  std::operator<<(poVar2,".\n\n");
  poVar2 = std::operator<<((ostream *)local_198,"Failing expression was ");
  poVar2 = std::operator<<(poVar2,"solvers.size()>=num_computational_layers");
  std::operator<<(poVar2,".\n");
  poVar2 = (ostream *)std::ostream::operator<<(local_198,std::boolalpha);
  poVar3 = std::operator<<(poVar2,"");
  std::operator<<(poVar3,"\n");
  t = (error_type)((ulong)poVar3 >> 0x20);
  a = (string *)__cxa_allocate_exception(0x30);
  std::__cxx11::ostringstream::str();
  fatal_error::fatal_error((fatal_error *)poVar2,t,a);
  __cxa_throw(a,&fatal_error::typeinfo,fatal_error::~fatal_error);
}

Assistant:

void update_parameters(sstack<solver_type> solvers, double learning_rate)
        {
            DLIB_CASSERT(solvers.size()>=num_computational_layers);
            // Don't try to adjust the parameters if this layer doesn't have any or the
            // learning rate is disabled for this layer.
            if (params_grad.size() != 0 && get_learning_rate_multiplier(details) != 0)
            {
                const tensor& step = solvers.top()(learning_rate, details, static_cast<const tensor&>(params_grad));
                tt::add(details.get_layer_params(), details.get_layer_params(), step);
            }
            subnetwork->update_parameters(solvers.pop(), learning_rate);
        }